

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::WFXMLScanner::scanAttValue(WFXMLScanner *this,XMLCh *attrName,XMLBuffer *toFill)

{
  ReaderMgr *this_00;
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Codes toEmit;
  bool escaped;
  XMLCh nextCh;
  XMLCh secondCh;
  XMLCh quoteCh;
  UnexpectedEOFException *local_58;
  XMLCh *local_50;
  XMLCh tmpBuf [9];
  
  toFill->fIndex = 0;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  bVar5 = ReaderMgr::skipIfQuote(this_00,&quoteCh);
  if (!bVar5) {
    return false;
  }
  uVar1 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum;
  secondCh = L'\0';
  local_50 = attrName;
  bVar5 = false;
LAB_002bc57d:
  bVar3 = bVar5;
  nextCh = ReaderMgr::getNextChar(this_00);
  if (nextCh == L'\0') {
    local_58 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
    UnexpectedEOFException::UnexpectedEOFException
              (local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/WFXMLScanner.cpp"
               ,0x603,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
    __cxa_throw(local_58,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
  }
  if (nextCh == quoteCh) {
    uVar2 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum;
    bVar5 = uVar1 == uVar2;
    if (bVar5) {
      return bVar5;
    }
    if (uVar2 <= uVar1 && !bVar5) {
      XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
      return bVar5;
    }
  }
  if (nextCh == L'&') goto code_r0x002bc5c6;
  if ((nextCh & 0xfc00U) == 0xdc00) {
    toEmit = Unexpected2ndSurrogateChar;
    if (!bVar3) {
LAB_002bc63e:
      XMLScanner::emitError(&this->super_XMLScanner,toEmit);
    }
LAB_002bc694:
    bVar4 = false;
  }
  else {
    if ((nextCh & 0xfc00U) != 0xd800) {
      toEmit = Expected2ndSurrogateChar;
      if (bVar3) goto LAB_002bc63e;
      if ((((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)nextCh] & 0x40
          ) == 0) {
        XMLString::binToText
                  ((uint)(ushort)nextCh,tmpBuf,8,0x10,(this->super_XMLScanner).fMemoryManager);
        XMLScanner::emitError
                  (&this->super_XMLScanner,InvalidCharacterInAttrValue,local_50,tmpBuf,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      goto LAB_002bc694;
    }
    bVar4 = true;
    if (bVar3) {
      XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
      bVar4 = bVar3;
    }
  }
  goto LAB_002bc696;
code_r0x002bc5c6:
  iVar6 = (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xd])
                    (this,1,&nextCh);
  bVar5 = false;
  bVar4 = bVar3;
  if (iVar6 == 1) {
LAB_002bc696:
    if (nextCh == L'<') {
      XMLScanner::emitError
                (&this->super_XMLScanner,BracketInAttrValue,local_50,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    else if ((char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                   [(ushort)nextCh] < '\0') {
      nextCh = L' ';
    }
    XMLBuffer::append(toFill,nextCh);
    bVar5 = bVar4;
    if (secondCh != L'\0') {
      XMLBuffer::append(toFill,secondCh);
      secondCh = L'\0';
    }
  }
  goto LAB_002bc57d;
}

Assistant:

bool WFXMLScanner::scanAttValue(const XMLCh* const attrName
                              ,     XMLBuffer&   toFill)
{
    // Reset the target buffer
    toFill.reset();

    // Get the next char which must be a single or double quote
    XMLCh quoteCh;
    if (!fReaderMgr.skipIfQuote(quoteCh))
        return false;

    //  We have to get the current reader because we have to ignore closing
    //  quotes until we hit the same reader again.
    const XMLSize_t curReader = fReaderMgr.getCurrentReaderNum();

    //  Loop until we get the attribute value. Note that we use a double
    //  loop here to avoid the setup/teardown overhead of the exception
    //  handler on every round.
    XMLCh   nextCh;
    XMLCh   secondCh = 0;
    bool    gotLeadingSurrogate = false;
    bool    escaped;
    while (true)
    {
    try
    {
        while(true)
        {
            nextCh = fReaderMgr.getNextChar();

            if (!nextCh)
                ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

            // Check for our ending quote in the same entity
            if (nextCh == quoteCh)
            {
                if (curReader == fReaderMgr.getCurrentReaderNum())
                    return true;

                // Watch for spillover into a previous entity
                if (curReader > fReaderMgr.getCurrentReaderNum())
                {
                    emitError(XMLErrs::PartialMarkupInEntity);
                    return false;
                }
            }

            //  Check for an entity ref now, before we let it affect our
            //  whitespace normalization logic below. We ignore the empty flag
            //  in this one.
            escaped = false;
            if (nextCh == chAmpersand)
            {
                if (scanEntityRef(true, nextCh, secondCh, escaped) != EntityExp_Returned)
                {
                    gotLeadingSurrogate = false;
                    continue;
                }
            }
            else if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
            {
                // Deal with surrogate pairs
                //  Its a leading surrogate. If we already got one, then
                //  issue an error, else set leading flag to make sure that
                //  we look for a trailing next time.
                if (gotLeadingSurrogate)
                {
                    emitError(XMLErrs::Expected2ndSurrogateChar);
                }
                else
                    gotLeadingSurrogate = true;
            }
            else
            {
                //  If its a trailing surrogate, make sure that we are
                //  prepared for that. Else, its just a regular char so make
                //  sure that we were not expected a trailing surrogate.
                if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                {
                    // Its trailing, so make sure we were expecting it
                    if (!gotLeadingSurrogate)
                        emitError(XMLErrs::Unexpected2ndSurrogateChar);
                }
                else
                {
                    //  Its just a char, so make sure we were not expecting a
                    //  trailing surrogate.
                    if (gotLeadingSurrogate) {
                        emitError(XMLErrs::Expected2ndSurrogateChar);
                    }
                    // Its got to at least be a valid XML character
                    else if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                    {
                        XMLCh tmpBuf[9];
                        XMLString::binToText
                        (
                            nextCh
                            , tmpBuf
                            , 8
                            , 16
                            , fMemoryManager
                        );
                        emitError(XMLErrs::InvalidCharacterInAttrValue, attrName, tmpBuf);
                    }
                }
                gotLeadingSurrogate = false;
            }

            //  If its not escaped, then make sure its not a < character, which
            //  is not allowed in attribute values.
            if (!escaped) {
                if (nextCh == chOpenAngle)
                    emitError(XMLErrs::BracketInAttrValue, attrName);
                else if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                    nextCh = chSpace;
            }

            // Else add it to the buffer
            toFill.append(nextCh);

            if (secondCh)
            {
                toFill.append(secondCh);
                secondCh=0;
            }
        }
    }
    catch(const EndOfEntityException&)
    {
        // Just eat it and continue.
        gotLeadingSurrogate = false;
        escaped = false;
    }
    }
    return true;
}